

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool MeCab::escape_csv_element(string *w)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  string *in_RDI;
  size_t j;
  string tmp;
  ulong local_48;
  allocator local_29;
  string local_28 [32];
  string *local_8;
  
  local_8 = in_RDI;
  lVar1 = std::__cxx11::string::find((char)in_RDI,0x2c);
  if ((lVar1 == -1) && (lVar1 = std::__cxx11::string::find((char)local_8,0x22), lVar1 == -1)) {
    return true;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"\"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  for (local_48 = 0; uVar2 = std::__cxx11::string::size(), local_48 < uVar2; local_48 = local_48 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
    if (*pcVar3 == '\"') {
      std::__cxx11::string::operator+=(local_28,'\"');
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
    std::__cxx11::string::operator+=(local_28,*pcVar3);
  }
  std::__cxx11::string::operator+=(local_28,'\"');
  std::__cxx11::string::operator=(local_8,local_28);
  std::__cxx11::string::~string(local_28);
  return true;
}

Assistant:

bool escape_csv_element(std::string *w) {
  if (w->find(',') != std::string::npos ||
      w->find('"') != std::string::npos) {
    std::string tmp = "\"";
    for (size_t j = 0; j < w->size(); j++) {
      if ((*w)[j] == '"') tmp += '"';
      tmp += (*w)[j];
    }
    tmp += '"';
    *w = tmp;
  }
  return true;
}